

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

wchar_t __thiscall chaiscript::Boxed_Number::get_as<wchar_t>(Boxed_Number *this)

{
  Common_Types CVar1;
  undefined8 uVar2;
  bad_any_cast *in_RDI;
  Boxed_Value *in_stack_ffffffffffffffe8;
  bad_any_cast *this_00;
  wchar_t local_4;
  
  this_00 = in_RDI;
  CVar1 = get_common_type(in_stack_ffffffffffffffe8);
  switch(CVar1) {
  case t_int32:
    local_4 = get_as_aux<wchar_t,int>((Boxed_Value *)0x2027c7);
    break;
  case t_double:
    local_4 = get_as_aux<wchar_t,double>((Boxed_Value *)0x202856);
    break;
  case t_uint8:
    local_4 = get_as_aux<wchar_t,unsigned_char>((Boxed_Value *)0x2027da);
    break;
  case t_int8:
    local_4 = get_as_aux<wchar_t,signed_char>((Boxed_Value *)0x2027ed);
    break;
  case t_uint16:
    local_4 = get_as_aux<wchar_t,unsigned_short>((Boxed_Value *)0x202800);
    break;
  case t_int16:
    local_4 = get_as_aux<wchar_t,short>((Boxed_Value *)0x202813);
    break;
  case t_uint32:
    local_4 = get_as_aux<wchar_t,unsigned_int>((Boxed_Value *)0x202826);
    break;
  case t_uint64:
    local_4 = get_as_aux<wchar_t,unsigned_long>((Boxed_Value *)0x202836);
    break;
  case t_int64:
    local_4 = get_as_aux<wchar_t,long>((Boxed_Value *)0x202846);
    break;
  case t_float:
    local_4 = get_as_aux<wchar_t,float>((Boxed_Value *)0x202866);
    break;
  case t_long_double:
    local_4 = get_as_aux<wchar_t,long_double>((Boxed_Value *)in_RDI);
    break;
  default:
    uVar2 = __cxa_allocate_exception(0x28);
    chaiscript::detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(uVar2,&chaiscript::detail::exception::bad_any_cast::typeinfo,
                chaiscript::detail::exception::bad_any_cast::~bad_any_cast);
  }
  return local_4;
}

Assistant:

Target get_as() const
      {
        switch (get_common_type(bv)) {
          case Common_Types::t_int32:
            return get_as_aux<Target, int32_t>(bv);
          case Common_Types::t_uint8:
            return get_as_aux<Target, uint8_t>(bv);
          case Common_Types::t_int8:
            return get_as_aux<Target, int8_t>(bv);
          case Common_Types::t_uint16:
            return get_as_aux<Target, uint16_t>(bv);
          case Common_Types::t_int16:
            return get_as_aux<Target, int16_t>(bv);
          case Common_Types::t_uint32:
            return get_as_aux<Target, uint32_t>(bv);
          case Common_Types::t_uint64:
            return get_as_aux<Target, uint64_t>(bv);
          case Common_Types::t_int64:
            return get_as_aux<Target, int64_t>(bv);
          case Common_Types::t_double:
            return get_as_aux<Target, double>(bv);
          case Common_Types::t_float:
            return get_as_aux<Target, float>(bv);
          case Common_Types::t_long_double:
            return get_as_aux<Target, long double>(bv);
        }

        throw chaiscript::detail::exception::bad_any_cast();
      }